

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O0

void SetInitialProfiles(N_Vector cc,N_Vector cp,N_Vector id,UserData webdata)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  UserData in_RDI;
  double dVar6;
  double dVar7;
  N_Vector unaff_retaddr;
  sunrealtype *idv;
  sunrealtype *cpv;
  sunrealtype *ccv;
  sunrealtype xyfactor;
  sunrealtype yy;
  sunrealtype xx;
  sunindextype np;
  sunindextype jy;
  sunindextype jx;
  sunindextype is;
  sunindextype yloc;
  sunindextype loc;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  lVar2 = N_VGetArrayPointer(in_RDI);
  lVar3 = N_VGetArrayPointer(in_RSI);
  lVar4 = N_VGetArrayPointer(in_RDX);
  lVar1 = *(long *)(in_RCX + 0x10);
  for (local_48 = 0; local_48 < 0x14; local_48 = local_48 + 1) {
    dVar6 = (double)local_48 * *(double *)(in_RCX + 0x30);
    for (local_40 = 0; local_40 < 0x14; local_40 = local_40 + 1) {
      dVar7 = (double)local_40 * *(double *)(in_RCX + 0x28);
      dVar7 = dVar7 * 16.0 * (1.0 - dVar7) * dVar6 * (1.0 - dVar6);
      lVar5 = local_48 * 0x28 + local_40 * 2;
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        if (local_38 < lVar1) {
          *(double *)(lVar2 + (lVar5 + local_38) * 8) =
               (double)(local_38 + 1) * dVar7 * dVar7 + 10.0;
          *(undefined8 *)(lVar4 + (lVar5 + local_38) * 8) = 0x3ff0000000000000;
        }
        else {
          *(undefined8 *)(lVar2 + (lVar5 + local_38) * 8) = 0x40f86a0000000000;
          *(undefined8 *)(lVar4 + (lVar5 + local_38) * 8) = 0;
        }
      }
    }
  }
  Fweb((sunrealtype)cpv,(N_Vector)idv,unaff_retaddr,in_RDI);
  for (local_48 = 0; local_48 < 0x14; local_48 = local_48 + 1) {
    for (local_40 = 0; local_40 < 0x14; local_40 = local_40 + 1) {
      for (local_38 = lVar1; local_38 < 2; local_38 = local_38 + 1) {
        *(undefined8 *)(lVar3 + (local_48 * 0x28 + local_40 * 2 + local_38) * 8) = 0;
      }
    }
  }
  return;
}

Assistant:

static void SetInitialProfiles(N_Vector cc, N_Vector cp, N_Vector id,
                               UserData webdata)
{
  sunindextype loc, yloc, is, jx, jy, np;
  sunrealtype xx, yy, xyfactor;
  sunrealtype *ccv, *cpv, *idv;

  ccv = N_VGetArrayPointer(cc);
  cpv = N_VGetArrayPointer(cp);
  idv = N_VGetArrayPointer(id);
  np  = webdata->np;

  /* Loop over grid, load cc values and id values. */
  for (jy = 0; jy < MY; jy++)
  {
    yy   = jy * webdata->dy;
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      xx       = jx * webdata->dx;
      xyfactor = SUN_RCONST(16.0) * xx * (ONE - xx) * yy * (ONE - yy);
      xyfactor *= xyfactor;
      loc = yloc + NUM_SPECIES * jx;

      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np)
        {
          ccv[loc + is] = SUN_RCONST(10.0) + (sunrealtype)(is + 1) * xyfactor;
          idv[loc + is] = ONE;
        }
        else
        {
          ccv[loc + is] = SUN_RCONST(1.0e5);
          idv[loc + is] = ZERO;
        }
      }
    }
  }

  /* Set c' for the prey by calling the function Fweb. */
  Fweb(ZERO, cc, cp, webdata);

  /* Set c' for predators to 0. */
  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = np; is < NUM_SPECIES; is++) { cpv[loc + is] = ZERO; }
    }
  }
}